

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateFloorLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  bool bVar1;
  Result local_88;
  Result local_50;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result_conflict *r;
  
  local_50.m_message._M_storage._M_storage[7] = '\0';
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result((Result *)__return_storage_ptr__);
  validateInputCount((Result_conflict *)&local_50,local_20,1,1);
  Result::operator=((Result *)__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar1 = Result::good((Result *)__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result_conflict *)&local_88,local_20,1,1);
    Result::operator=((Result *)__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateFloorLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    return r;
}